

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O2

idx_t __thiscall
duckdb::ChimpGroupState<unsigned_long>::CalculatePackedDataCount
          (ChimpGroupState<unsigned_long> *this)

{
  idx_t iVar1;
  idx_t iVar2;
  
  iVar1 = 0;
  for (iVar2 = 0; this->max_flags_to_read != iVar2; iVar2 = iVar2 + 1) {
    iVar1 = iVar1 + (this->flags[iVar2 + 1] == TRAILING_EXCEEDS_THRESHOLD);
  }
  return iVar1;
}

Assistant:

idx_t CalculatePackedDataCount() const {
		idx_t count = 0;
		for (idx_t i = 0; i < max_flags_to_read; i++) {
			count += flags[1 + i] == ChimpConstants::Flags::TRAILING_EXCEEDS_THRESHOLD;
		}
		return count;
	}